

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O0

long jpc_bitstream_getbits(jpc_bitstream_t *bitstream,int n)

{
  int iVar1;
  uint local_30;
  jpc_bitstream_t *pjStack_28;
  int u;
  long v;
  int n_local;
  jpc_bitstream_t *bitstream_local;
  
  if ((n < 0) || (0x1f < n)) {
    bitstream_local = (jpc_bitstream_t *)0xffffffffffffffff;
  }
  else {
    pjStack_28 = (jpc_bitstream_t *)0x0;
    v._4_4_ = n;
    while (v._4_4_ = v._4_4_ + -1, -1 < v._4_4_) {
      if ((bitstream->openmode_ & 1U) == 0) {
        __assert_fail("(bitstream)->openmode_ & JPC_BITSTREAM_READ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                      ,0xcc,"long jpc_bitstream_getbits(jpc_bitstream_t *, int)");
      }
      iVar1 = bitstream->cnt_ + -1;
      bitstream->cnt_ = iVar1;
      if (iVar1 < 0) {
        local_30 = jpc_bitstream_fillbuf(bitstream);
      }
      else {
        local_30 = (uint)(bitstream->buf_ >> ((byte)bitstream->cnt_ & 0x3f)) & 1;
      }
      if ((int)local_30 < 0) {
        return -1;
      }
      pjStack_28 = (jpc_bitstream_t *)((long)pjStack_28 << 1 | (long)(int)local_30);
    }
    bitstream_local = pjStack_28;
  }
  return (long)bitstream_local;
}

Assistant:

long jpc_bitstream_getbits(jpc_bitstream_t *bitstream, int n)
{
	long v;
	int u;

	/* We can reliably get at most 31 bits since ISO/IEC 9899 only
	  guarantees that a long can represent values up to 2^31-1. */
	//assert(n >= 0 && n < 32);
	if (n < 0 || n >= 32) {
		return -1;
	}

	/* Get the number of bits requested from the specified bit stream. */
	v = 0;
	while (--n >= 0) {
		if ((u = jpc_bitstream_getbit(bitstream)) < 0) {
			return -1;
		}
		v = (v << 1) | u;
	}
	return v;
}